

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DecorationManager::HasDecoration
          (DecorationManager *this,uint32_t id,uint32_t decoration)

{
  bool has_decoration;
  undefined1 local_29;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_29;
  local_29 = 0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp:502:37)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp:502:37)>
             ::_M_manager;
  ForEachDecoration(this,id,decoration,
                    (function<void_(const_spvtools::opt::Instruction_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return (bool)local_29;
}

Assistant:

bool DecorationManager::HasDecoration(uint32_t id, uint32_t decoration) const {
  bool has_decoration = false;
  ForEachDecoration(id, decoration, [&has_decoration](const Instruction&) {
    has_decoration = true;
  });
  return has_decoration;
}